

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O0

int fy_vdiag(fy_diag *diag,fy_diag_ctx *fydc,char *fmt,__va_list_tag *ap)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  fy_error_module fVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  void *__format;
  int iVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  char **__s;
  ulong uVar16;
  undefined8 uStack_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  int local_2bc;
  char *local_2b8;
  int local_2ac;
  char *local_2a8;
  char *local_2a0;
  int local_294;
  char *local_290;
  int local_284;
  char *local_280;
  char *local_278;
  uint local_26c;
  char *local_268;
  uint local_25c;
  char *local_258;
  char *local_250;
  uint local_244;
  char *local_240;
  uint local_234;
  char *local_230;
  char *local_228;
  fy_diag *local_220;
  char *local_218;
  ulong local_210;
  bool local_201;
  char *local_200;
  char *local_1f8;
  size_t local_1f0;
  char *local_1e8;
  char *local_1e0;
  bool local_1d1;
  char *local_1d0;
  char *local_1c8;
  size_t local_1c0;
  char *local_1b8;
  char *local_1b0;
  bool local_1a1;
  char *local_1a0;
  bool local_191;
  char *local_190;
  bool local_181;
  char *local_180;
  char *local_178;
  char *local_170;
  char *_s_4;
  char *_buf_4;
  int _sizew_4;
  int _size_4;
  char *__fmt_4;
  char *local_148;
  char *_s_3;
  char *_buf_3;
  int _sizew_3;
  int _size_3;
  char *__fmt_3;
  char *local_120;
  char *_s_2;
  char *_buf_2;
  int _sizew_2;
  int _size_2;
  char *__fmt_2;
  char *local_f8;
  char *_s_1;
  char *_buf_1;
  int _sizew_1;
  int _size_1;
  char *__fmt_1;
  char *local_d0;
  char *_s;
  char *_buf;
  int _sizew;
  int _size;
  va_list _ap_orig;
  char *__fmt;
  int rc;
  fy_error_type level;
  char *color_end;
  char *color_start;
  char *file_stripped;
  char *modulestr;
  char *typestr;
  char *position;
  char *source;
  char *msg;
  __va_list_tag *ap_local;
  char *fmt_local;
  fy_diag_ctx *fydc_local;
  fy_diag *diag_local;
  
  __s = &local_2e8;
  position = (char *)0x0;
  typestr = (char *)0x0;
  modulestr = (char *)0x0;
  file_stripped = (char *)0x0;
  color_end = (char *)0x0;
  _rc = (char *)0x0;
  if (((diag == (fy_diag *)0x0) || (fydc == (fy_diag_ctx *)0x0)) || (fmt == (char *)0x0)) {
    diag_local._4_4_ = -1;
  }
  else {
    __fmt._4_4_ = fydc->level;
    if ((FYET_WARNING < __fmt._4_4_) && ((diag->field_0x3c & 1) != 0)) {
      __fmt._4_4_ = FYET_NOTICE;
    }
    if (__fmt._4_4_ < (diag->cfg).level) {
      __fmt._0_4_ = 0;
    }
    else if (((diag->cfg).module_mask & 1 << ((byte)fydc->module & 0x1f)) == 0) {
      __fmt._0_4_ = 0;
    }
    else {
      _s = (char *)0x0;
      _ap_orig[0].overflow_arg_area = ap->reg_save_area;
      _sizew = ap->gp_offset;
      unique0x100003d6 = ap->fp_offset;
      _ap_orig[0]._0_8_ = ap->overflow_arg_area;
      uStack_2f0 = 0x122056;
      _ap_orig[0].reg_save_area = fmt;
      _buf._4_4_ = vsnprintf((char *)0x0,0,fmt,&_sizew);
      __format = _ap_orig[0].reg_save_area;
      if (_buf._4_4_ != -1) {
        lVar6 = -((long)_buf._4_4_ + 0x10U & 0xfffffffffffffff0);
        __s = (char **)((long)&local_2e8 + lVar6);
        iVar9 = _buf._4_4_ + 1;
        _s = (char *)__s;
        *(undefined8 *)((long)&uStack_2f0 + lVar6) = 0x1220b2;
        _buf._0_4_ = vsnprintf((char *)__s,(long)iVar9,(char *)__format,ap);
        pcVar1 = _s;
        if (_buf._4_4_ != (int)_buf) {
          *(undefined8 *)((long)&uStack_2f0 + lVar6) = 0x1220e7;
          __assert_fail("_size == _sizew",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                        ,0x10a,
                        "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                       );
        }
        local_180 = _s;
        *(undefined8 *)((long)&uStack_2f0 + lVar6) = 0x122101;
        sVar10 = strlen(pcVar1);
        local_d0 = local_180 + sVar10;
        while( true ) {
          local_181 = false;
          if (_s < local_d0) {
            local_181 = local_d0[-1] == '\n';
          }
          if (local_181 == false) break;
          pcVar1 = local_d0 + -1;
          local_d0 = local_d0 + -1;
          *pcVar1 = '\0';
        }
      }
      pcVar1 = _s;
      __fmt_1 = _s;
      pcVar12 = (char *)__s;
      if (((byte)(diag->cfg).field_0x20 >> 1 & 1) != 0) {
        if (fydc->source_file == (char *)0x0) {
          color_start = "";
        }
        else {
          pcVar11 = fydc->source_file;
          *(char *)((long)__s + -8) = -0x4a;
          *(char *)((long)__s + -7) = '!';
          *(char *)((long)__s + -6) = '\x12';
          *(char *)((long)__s + -5) = '\0';
          *(char *)((long)__s + -4) = '\0';
          *(char *)((long)__s + -3) = '\0';
          *(char *)((long)__s + -2) = '\0';
          *(char *)((long)__s + -1) = '\0';
          pcVar11 = strrchr(pcVar11,0x2f);
          if (pcVar11 == (char *)0x0) {
            color_start = fydc->source_file;
          }
          else {
            color_start = pcVar11 + 1;
          }
        }
        __sizew_1 = "%s:%d @%s()%s";
        _s_1 = (char *)0x0;
        uVar2 = fydc->source_line;
        pcVar11 = fydc->source_func;
        *(char **)((long)__s + -0x10) = " ";
        *(char *)((long)__s + -0x18) = '9';
        *(char *)((long)__s + -0x17) = '\"';
        *(char *)((long)__s + -0x16) = '\x12';
        *(char *)((long)__s + -0x15) = '\0';
        *(char *)((long)__s + -0x14) = '\0';
        *(char *)((long)__s + -0x13) = '\0';
        *(char *)((long)__s + -0x12) = '\0';
        *(char *)((long)__s + -0x11) = '\0';
        _buf_1._4_4_ = snprintf((char *)0x0,0,"%s:%d @%s()%s",color_start,(ulong)uVar2,pcVar11);
        pcVar11 = __sizew_1;
        if (_buf_1._4_4_ != -1) {
          lVar6 = -((long)_buf_1._4_4_ + 0x10U & 0xfffffffffffffff0);
          pcVar12 = (char *)((long)__s + lVar6);
          iVar9 = _buf_1._4_4_ + 1;
          uVar2 = fydc->source_line;
          pcVar5 = fydc->source_func;
          _s_1 = pcVar12;
          *(char **)(pcVar12 + -0x10) = " ";
          pcVar12[-0x18] = -0x4d;
          pcVar12[-0x17] = '\"';
          pcVar12[-0x16] = '\x12';
          pcVar12[-0x15] = '\0';
          pcVar12[-0x14] = '\0';
          pcVar12[-0x13] = '\0';
          pcVar12[-0x12] = '\0';
          pcVar12[-0x11] = '\0';
          _buf_1._0_4_ = snprintf(pcVar12,(long)iVar9,pcVar11,color_start,(ulong)uVar2,pcVar5);
          pcVar11 = _s_1;
          if (_buf_1._4_4_ != (int)_buf_1) {
            pcVar12[-8] = -0x14;
            pcVar12[-7] = '\"';
            pcVar12[-6] = '\x12';
            pcVar12[-5] = '\0';
            pcVar12[-4] = '\0';
            pcVar12[-3] = '\0';
            pcVar12[-2] = '\0';
            pcVar12[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x117,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          local_190 = _s_1;
          builtin_strncpy((char *)((long)__s + lVar6 + -8),"\x06#\x12",4);
          pcVar12[-4] = '\0';
          pcVar12[-3] = '\0';
          pcVar12[-2] = '\0';
          pcVar12[-1] = '\0';
          sVar10 = strlen(pcVar11);
          local_f8 = local_190 + sVar10;
          while( true ) {
            local_191 = false;
            if (_s_1 < local_f8) {
              local_191 = local_f8[-1] == '\n';
            }
            if (local_191 == false) break;
            pcVar11 = local_f8 + -1;
            local_f8 = local_f8 + -1;
            *pcVar11 = '\0';
          }
        }
        __fmt_2 = _s_1;
        position = _s_1;
      }
      pcVar11 = pcVar12;
      if (((((byte)(diag->cfg).field_0x20 >> 2 & 1) != 0) && (-1 < fydc->line)) &&
         (-1 < fydc->column)) {
        __sizew_2 = "<%3d:%2d>%s";
        _s_2 = (char *)0x0;
        uVar2 = fydc->line;
        uVar3 = fydc->column;
        *(undefined8 *)(pcVar12 + -8) = 0x1223ff;
        _buf_2._4_4_ = snprintf((char *)0x0,0,"<%3d:%2d>%s",(ulong)uVar2,(ulong)uVar3,": ");
        pcVar5 = __sizew_2;
        if (_buf_2._4_4_ != -1) {
          lVar6 = -((long)_buf_2._4_4_ + 0x10U & 0xfffffffffffffff0);
          pcVar11 = pcVar12 + lVar6;
          iVar9 = _buf_2._4_4_ + 1;
          uVar2 = fydc->line;
          uVar3 = fydc->column;
          _s_2 = pcVar11;
          builtin_strncpy(pcVar12 + lVar6 + -8,"h$\x12",4);
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          _buf_2._0_4_ = snprintf(pcVar11,(long)iVar9,pcVar5,(ulong)uVar2,(ulong)uVar3,": ");
          pcVar12 = _s_2;
          if (_buf_2._4_4_ != (int)_buf_2) {
            pcVar11[-8] = -99;
            pcVar11[-7] = '$';
            pcVar11[-6] = '\x12';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x11c,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          local_1a0 = _s_2;
          pcVar11[-8] = -0x49;
          pcVar11[-7] = '$';
          pcVar11[-6] = '\x12';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          sVar10 = strlen(pcVar12);
          local_120 = local_1a0 + sVar10;
          while( true ) {
            local_1a1 = false;
            if (_s_2 < local_120) {
              local_1a1 = local_120[-1] == '\n';
            }
            if (local_1a1 == false) break;
            pcVar12 = local_120 + -1;
            local_120 = local_120 + -1;
            *pcVar12 = '\0';
          }
        }
        __fmt_3 = _s_2;
        typestr = _s_2;
      }
      pcVar12 = pcVar11;
      if (((byte)(diag->cfg).field_0x20 >> 3 & 1) != 0) {
        __sizew_3 = "[%s]%s";
        _s_3 = (char *)0x0;
        local_1b0 = "[%s]%s";
        *(undefined8 *)(pcVar11 + -8) = 0x122582;
        pcVar13 = fy_error_level_str(__fmt._4_4_);
        pcVar5 = local_1b0;
        *(undefined8 *)(pcVar11 + -8) = 0x1225a1;
        _buf_3._4_4_ = snprintf((char *)0x0,0,pcVar5,pcVar13,": ");
        if (_buf_3._4_4_ != -1) {
          lVar6 = -((long)_buf_3._4_4_ + 0x10U & 0xfffffffffffffff0);
          pcVar12 = pcVar11 + lVar6;
          local_1c0 = (size_t)(_buf_3._4_4_ + 1);
          local_1b8 = __sizew_3;
          _s_3 = pcVar12;
          local_1c8 = pcVar12;
          builtin_strncpy(pcVar11 + lVar6 + -8,"\f&\x12",4);
          pcVar12[-4] = '\0';
          pcVar12[-3] = '\0';
          pcVar12[-2] = '\0';
          pcVar12[-1] = '\0';
          pcVar14 = fy_error_level_str(__fmt._4_4_);
          pcVar13 = local_1b8;
          sVar10 = local_1c0;
          pcVar5 = local_1c8;
          builtin_strncpy(pcVar11 + lVar6 + -8,"2&\x12",4);
          pcVar12[-4] = '\0';
          pcVar12[-3] = '\0';
          pcVar12[-2] = '\0';
          pcVar12[-1] = '\0';
          _buf_3._0_4_ = snprintf(pcVar5,sVar10,pcVar13,pcVar14,": ");
          pcVar5 = _s_3;
          if (_buf_3._4_4_ != (int)_buf_3) {
            builtin_strncpy(pcVar11 + lVar6 + -8,"g&\x12",4);
            pcVar12[-4] = '\0';
            pcVar12[-3] = '\0';
            pcVar12[-2] = '\0';
            pcVar12[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x120,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          local_1d0 = _s_3;
          pcVar12[-8] = -0x7f;
          pcVar12[-7] = '&';
          pcVar12[-6] = '\x12';
          pcVar12[-5] = '\0';
          pcVar12[-4] = '\0';
          pcVar12[-3] = '\0';
          pcVar12[-2] = '\0';
          pcVar12[-1] = '\0';
          sVar10 = strlen(pcVar5);
          local_148 = local_1d0 + sVar10;
          while( true ) {
            local_1d1 = false;
            if (_s_3 < local_148) {
              local_1d1 = local_148[-1] == '\n';
            }
            if (local_1d1 == false) break;
            pcVar11 = local_148 + -1;
            local_148 = local_148 + -1;
            *pcVar11 = '\0';
          }
        }
        __fmt_4 = _s_3;
        modulestr = _s_3;
      }
      pcVar11 = pcVar12;
      if (((byte)(diag->cfg).field_0x20 >> 4 & 1) != 0) {
        __sizew_4 = "<%s>%s";
        _s_4 = (char *)0x0;
        local_1e0 = "<%s>%s";
        fVar4 = fydc->module;
        *(undefined8 *)(pcVar12 + -8) = 0x12274d;
        pcVar13 = fy_error_module_str(fVar4);
        pcVar5 = local_1e0;
        *(undefined8 *)(pcVar12 + -8) = 0x12276c;
        _buf_4._4_4_ = snprintf((char *)0x0,0,pcVar5,pcVar13,": ");
        if (_buf_4._4_4_ != -1) {
          lVar6 = -((long)_buf_4._4_4_ + 0x10U & 0xfffffffffffffff0);
          pcVar11 = pcVar12 + lVar6;
          local_1f0 = (size_t)(_buf_4._4_4_ + 1);
          local_1e8 = __sizew_4;
          fVar4 = fydc->module;
          local_1f8 = pcVar11;
          _s_4 = pcVar11;
          pcVar11[-8] = -0x28;
          pcVar11[-7] = '\'';
          pcVar11[-6] = '\x12';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          pcVar14 = fy_error_module_str(fVar4);
          pcVar13 = local_1e8;
          sVar10 = local_1f0;
          pcVar5 = local_1f8;
          pcVar11[-8] = -2;
          pcVar11[-7] = '\'';
          pcVar11[-6] = '\x12';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          _buf_4._0_4_ = snprintf(pcVar5,sVar10,pcVar13,pcVar14,": ");
          pcVar5 = _s_4;
          if (_buf_4._4_4_ != (int)_buf_4) {
            builtin_strncpy(pcVar12 + lVar6 + -8,"3(\x12",4);
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x124,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          local_200 = _s_4;
          builtin_strncpy(pcVar12 + lVar6 + -8,"M(\x12",4);
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          sVar10 = strlen(pcVar5);
          local_170 = local_200 + sVar10;
          while( true ) {
            local_201 = false;
            if (_s_4 < local_170) {
              local_201 = local_170[-1] == '\n';
            }
            if (local_201 == false) break;
            pcVar12 = local_170 + -1;
            local_170 = local_170 + -1;
            *pcVar12 = '\0';
          }
        }
        local_178 = _s_4;
        file_stripped = _s_4;
      }
      if (((diag->cfg).field_0x20 & 1) != 0) {
        local_210 = (ulong)__fmt._4_4_;
        switch(local_210) {
        case 0:
          color_end = "\x1b[37m";
          break;
        case 1:
          color_end = "\x1b[37;1m";
          break;
        case 2:
          color_end = "\x1b[34;1m";
          break;
        case 3:
          color_end = "\x1b[33;1m";
          break;
        case 4:
          color_end = "\x1b[31;1m";
        }
        if (color_end != (char *)0x0) {
          _rc = "\x1b[0m";
        }
      }
      local_218 = color_end;
      if (color_end == (char *)0x0) {
        local_228 = "";
      }
      else {
        local_228 = color_end;
      }
      pcVar12 = local_228;
      local_230 = local_228;
      if (position == (char *)0x0) {
        local_234 = 0;
      }
      else {
        local_234 = (diag->cfg).source_width;
      }
      local_244 = local_234;
      local_240 = position;
      if (position == (char *)0x0) {
        local_250 = "";
      }
      else {
        local_250 = position;
      }
      pcVar5 = local_250;
      local_258 = local_250;
      if (typestr == (char *)0x0) {
        local_25c = 0;
      }
      else {
        local_25c = (diag->cfg).position_width;
      }
      local_26c = local_25c;
      local_268 = typestr;
      if (typestr == (char *)0x0) {
        local_278 = "";
      }
      else {
        local_278 = typestr;
      }
      local_280 = local_278;
      if (modulestr == (char *)0x0) {
        local_284 = 0;
      }
      else {
        local_284 = (diag->cfg).type_width;
      }
      iVar9 = local_284;
      local_294 = local_284;
      local_290 = modulestr;
      if (modulestr == (char *)0x0) {
        local_2a0 = "";
      }
      else {
        local_2a0 = modulestr;
      }
      pcVar13 = local_2a0;
      local_2a8 = local_2a0;
      if (file_stripped == (char *)0x0) {
        local_2ac = 0;
      }
      else {
        local_2ac = (diag->cfg).module_width;
      }
      iVar8 = local_2ac;
      local_2bc = local_2ac;
      local_2b8 = file_stripped;
      if (file_stripped == (char *)0x0) {
        local_2c8 = "";
      }
      else {
        local_2c8 = file_stripped;
      }
      pcVar14 = local_2c8;
      local_2e0 = local_2c8;
      local_2d8 = pcVar1;
      local_2d0 = _rc;
      if (_rc == (char *)0x0) {
        local_2e8 = "";
      }
      else {
        local_2e8 = _rc;
      }
      pcVar7 = local_2e8;
      uVar16 = (ulong)local_25c;
      uVar15 = (ulong)local_234;
      local_220 = diag;
      *(char **)(pcVar11 + -0x40) = local_278;
      *(int *)(pcVar11 + -0x38) = iVar9;
      *(char **)(pcVar11 + -0x30) = pcVar13;
      *(int *)(pcVar11 + -0x28) = iVar8;
      *(char **)(pcVar11 + -0x20) = pcVar14;
      *(char **)(pcVar11 + -0x18) = pcVar1;
      *(char **)(pcVar11 + -0x10) = pcVar7;
      *(undefined8 *)(pcVar11 + -0x48) = 0x122c21;
      __fmt._0_4_ = fy_diag_printf(diag,"%s%*s%*s%*s%*s%s%s\n",pcVar12,uVar15,pcVar5,uVar16);
      if (0 < (int)__fmt) {
        __fmt._0_4_ = (int)__fmt + 1;
      }
    }
    if (((diag->field_0x3c & 1) == 0) && (FYET_WARNING < fydc->level)) {
      diag->field_0x3c = diag->field_0x3c & 0xfe | 1;
    }
    diag_local._4_4_ = (int)__fmt;
  }
  return diag_local._4_4_;
}

Assistant:

int fy_vdiag(struct fy_diag *diag, const struct fy_diag_ctx *fydc,
             const char *fmt, va_list ap) {
    char *msg = NULL;
    char *source = NULL, *position = NULL, *typestr = NULL, *modulestr = NULL;
    const char *file_stripped = NULL;
    const char *color_start = NULL, *color_end = NULL;
    enum fy_error_type level;
    int rc;

    if (!diag || !fydc || !fmt)
        return -1;

    level = fydc->level;

    /* turn errors into notices while not reset */
    if (level >= FYET_ERROR && diag->on_error)
        level = FYET_NOTICE;

    if (level < diag->cfg.level) {
        rc = 0;
        goto out;
    }

    /* check module enable mask */
    if (!(diag->cfg.module_mask & FY_BIT(fydc->module))) {
        rc = 0;
        goto out;
    }

    msg = alloca_vsprintf(fmt, ap);

    /* source part */
    if (diag->cfg.show_source) {
        if (fydc->source_file) {
            file_stripped = strrchr(fydc->source_file, '/');
            if (!file_stripped)
                file_stripped = fydc->source_file;
            else
                file_stripped++;
        } else
            file_stripped = "";
        source = alloca_sprintf("%s:%d @%s()%s",
                                file_stripped, fydc->source_line, fydc->source_func, " ");
    }

    /* position part */
    if (diag->cfg.show_position && fydc->line >= 0 && fydc->column >= 0)
        position = alloca_sprintf("<%3d:%2d>%s", fydc->line, fydc->column, ": ");

    /* type part */
    if (diag->cfg.show_type)
        typestr = alloca_sprintf("[%s]%s", fy_error_level_str(level), ": ");

    /* module part */
    if (diag->cfg.show_module)
        modulestr = alloca_sprintf("<%s>%s", fy_error_module_str(fydc->module), ": ");

    if (diag->cfg.colorize) {
        switch (level) {
            case FYET_DEBUG:
                color_start = "\x1b[37m";    /* normal white */
                break;
            case FYET_INFO:
                color_start = "\x1b[37;1m";    /* bright white */
                break;
            case FYET_NOTICE:
                color_start = "\x1b[34;1m";    /* bright blue */
                break;
            case FYET_WARNING:
                color_start = "\x1b[33;1m";    /* bright yellow */
                break;
            case FYET_ERROR:
                color_start = "\x1b[31;1m";    /* bright red */
                break;
            default:    /* handles FYET_MAX */
                break;
        }
        if (color_start)
            color_end = "\x1b[0m";
    }

    rc = fy_diag_printf(diag, "%s" "%*s" "%*s" "%*s" "%*s" "%s" "%s\n",
                        color_start ?: "",
                        source ? diag->cfg.source_width : 0, source ?: "",
                        position ? diag->cfg.position_width : 0, position ?: "",
                        typestr ? diag->cfg.type_width : 0, typestr ?: "",
                        modulestr ? diag->cfg.module_width : 0, modulestr ?: "",
                        msg,
                        color_end ?: "");

    if (rc > 0)
        rc++;

    out:
    /* if it's the first error we're generating set the
     * on_error flag until the top caller clears it
     */
    if (!diag->on_error && fydc->level >= FYET_ERROR)
        diag->on_error = true;

    return rc;
}